

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e,int line)

{
  int iVar1;
  int line_local;
  expdesc *e_local;
  UnOpr op_local;
  FuncState *fs_local;
  
  if (op < OPR_NOT) {
    iVar1 = constfolding(fs,op + 0xc,e,&luaK_prefix::ef);
    if (iVar1 != 0) {
      return;
    }
  }
  else {
    if (op == OPR_NOT) {
      codenot(fs,e);
      return;
    }
    if (op != OPR_LEN) {
      return;
    }
  }
  codeunexpval(fs,op + 0x19,e,line);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e, int line) {
  static expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};  /* fake 2nd operand */
  switch (op) {
    case OPR_MINUS: case OPR_BNOT:
      if (constfolding(fs, op + LUA_OPUNM, e, &ef))
        break;
      /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, cast(OpCode, op + OP_UNM), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}